

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,curl_llist *list)

{
  curl_malloc_callback p_Var1;
  undefined2 uVar2;
  size_t sVar3;
  void *ne;
  char *pcVar4;
  char **ppcVar6;
  long lVar5;
  
  if (list->size != 0) {
    Curl_llist_destroy(list,(void *)0x0);
  }
  if (sites != (char **)0x0) {
    Curl_llist_init(list,site_blacklist_llist_dtor);
    pcVar4 = *sites;
    if (pcVar4 != (char *)0x0) {
      ppcVar6 = sites + 1;
      do {
        p_Var1 = Curl_cmalloc;
        sVar3 = strlen(pcVar4);
        ne = (*p_Var1)(sVar3 + 0x20);
        if (ne == (void *)0x0) {
          Curl_llist_destroy(list,(void *)0x0);
          return CURLM_OUT_OF_MEMORY;
        }
        strcpy((char *)((long)ne + 0x1a),ppcVar6[-1]);
        pcVar4 = strchr((char *)((long)ne + 0x1a),0x3a);
        if (pcVar4 == (char *)0x0) {
          uVar2 = 0x50;
        }
        else {
          *pcVar4 = '\0';
          lVar5 = strtol(pcVar4 + 1,(char **)0x0,10);
          uVar2 = (undefined2)lVar5;
        }
        *(undefined2 *)((long)ne + 0x18) = uVar2;
        Curl_llist_insert_next(list,list->tail,ne,(curl_llist_element *)ne);
        pcVar4 = *ppcVar6;
        ppcVar6 = ppcVar6 + 1;
      } while (pcVar4 != (char *)0x0);
    }
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,
                                           struct curl_llist *list)
{
  /* Free the old list */
  if(list->size)
    Curl_llist_destroy(list, NULL);

  if(sites) {
    Curl_llist_init(list, (curl_llist_dtor) site_blacklist_llist_dtor);

    /* Parse the URLs and populate the list */
    while(*sites) {
      char *port;
      struct site_blacklist_entry *entry;

      entry = malloc(sizeof(struct site_blacklist_entry) + strlen(*sites));
      if(!entry) {
        Curl_llist_destroy(list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }
      strcpy(entry->hostname, *sites);

      port = strchr(entry->hostname, ':');
      if(port) {
        *port = '\0';
        port++;
        entry->port = (unsigned short)strtol(port, NULL, 10);
      }
      else {
        /* Default port number for HTTP */
        entry->port = 80;
      }

      Curl_llist_insert_next(list, list->tail, entry, &entry->list);
      sites++;
    }
  }

  return CURLM_OK;
}